

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyStrnicmp(char *zLeft,char *zRight,sxu32 SLen)

{
  byte bVar1;
  byte bVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  sxu32 sVar10;
  __int32_t _Var11;
  long lVar12;
  sxu32 local_48;
  sxu32 local_40;
  sxu32 local_38;
  ulong uVar9;
  
  if (zLeft != (char *)0x0) {
    if (zRight != (char *)0x0 && *zLeft != '\0') {
      if (*zRight == '\0') {
        return 1;
      }
      local_48 = SLen - 3;
      local_40 = SLen - 2;
      local_38 = SLen - 1;
      lVar12 = 0;
      pbVar5 = (byte *)zRight;
      while( true ) {
        sVar10 = (sxu32)lVar12;
        if (SLen == sVar10) {
          return 0;
        }
        bVar1 = zLeft[lVar12];
        uVar7 = (ulong)bVar1;
        if (uVar7 == 0) break;
        bVar2 = zRight[lVar12];
        uVar9 = (ulong)bVar2;
        uVar8 = (uint)bVar2;
        if (uVar9 == 0) {
LAB_001146f4:
          _Var11 = (__int32_t)uVar7;
          if (0xbf < (byte)uVar7) goto LAB_0011471f;
          goto LAB_001146fa;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar7 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar6 = (*pp_Var4)[uVar7];
        }
        else {
          uVar6 = (uint)bVar1;
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar9 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar8 = (*pp_Var4)[uVar9];
        }
        if (uVar6 != uVar8) {
          pbVar5 = (byte *)(zRight + lVar12);
          goto LAB_001146f4;
        }
        if (local_38 == sVar10) {
          return 0;
        }
        bVar1 = zLeft[lVar12 + 1];
        uVar7 = (ulong)bVar1;
        if (uVar7 == 0) {
          pbVar5 = (byte *)(zRight + lVar12 + 1);
          goto LAB_001146de;
        }
        bVar2 = zRight[lVar12 + 1];
        uVar9 = (ulong)bVar2;
        uVar8 = (uint)bVar2;
        if (uVar9 == 0) {
          pbVar5 = (byte *)(zRight + lVar12 + 1);
          goto LAB_001146f4;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar7 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar6 = (*pp_Var4)[uVar7];
        }
        else {
          uVar6 = (uint)bVar1;
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar9 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar8 = (*pp_Var4)[uVar9];
        }
        if (uVar6 != uVar8) {
          pbVar5 = pbVar5 + 1;
          goto LAB_001146f4;
        }
        if (local_40 == sVar10) {
          return 0;
        }
        bVar1 = zLeft[lVar12 + 2];
        uVar7 = (ulong)bVar1;
        if (uVar7 == 0) {
          pbVar5 = (byte *)(zRight + lVar12 + 2);
          goto LAB_001146de;
        }
        bVar2 = zRight[lVar12 + 2];
        uVar9 = (ulong)bVar2;
        uVar8 = (uint)bVar2;
        if (uVar9 == 0) {
          pbVar5 = pbVar5 + 2;
          goto LAB_001146f4;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar7 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar6 = (*pp_Var4)[uVar7];
        }
        else {
          uVar6 = (uint)bVar1;
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar9 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar8 = (*pp_Var4)[uVar9];
        }
        if (uVar6 != uVar8) {
          pbVar5 = (byte *)(zRight + lVar12 + 2);
          goto LAB_001146f4;
        }
        if (local_48 == sVar10) {
          return 0;
        }
        bVar1 = zLeft[lVar12 + 3];
        uVar7 = (ulong)bVar1;
        if (uVar7 == 0) {
          pbVar5 = (byte *)(zRight + lVar12 + 3);
          goto LAB_001146de;
        }
        bVar2 = zRight[lVar12 + 3];
        uVar9 = (ulong)bVar2;
        uVar8 = (uint)bVar2;
        if (uVar9 == 0) {
          pbVar5 = (byte *)(zRight + lVar12 + 3);
          goto LAB_001146f4;
        }
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar7 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar6 = (*pp_Var4)[uVar7];
        }
        else {
          uVar6 = (uint)bVar1;
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar9 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar8 = (*pp_Var4)[uVar9];
        }
        if (uVar6 != uVar8) {
          pbVar5 = pbVar5 + 3;
          goto LAB_001146f4;
        }
        pbVar5 = pbVar5 + 4;
        lVar12 = lVar12 + 4;
      }
      pbVar5 = (byte *)(zRight + lVar12);
LAB_001146de:
      uVar7 = 0;
LAB_001146fa:
      _Var11 = (__int32_t)uVar7;
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + uVar7 * 2 + 1) & 1) != 0) {
        pp_Var4 = __ctype_tolower_loc();
        _Var11 = (*pp_Var4)[uVar7];
      }
LAB_0011471f:
      uVar7 = (ulong)*pbVar5;
      uVar8 = (uint)*pbVar5;
      if ((uVar7 < 0xc0) &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar7 * 2 + 1) & 1) != 0)) {
        pp_Var4 = __ctype_tolower_loc();
        uVar8 = (*pp_Var4)[uVar7];
      }
      return _Var11 - uVar8;
    }
    if (*zLeft != '\0') {
      return 1;
    }
  }
  if (zRight == (char *)0x0) {
    return 0;
  }
  return -(uint)(*zRight != '\0');
}

Assistant:

JX9_PRIVATE sxi32 SyStrnicmp(const char *zLeft, const char *zRight, sxu32 SLen)
{
  	register unsigned char *p = (unsigned char *)zLeft;
	register unsigned char *q = (unsigned char *)zRight;
	
	if( SX_EMPTY_STR(p) || SX_EMPTY_STR(q) ){
		return SX_EMPTY_STR(p)? SX_EMPTY_STR(q) ? 0 : -1 :1;
	}
	for(;;){
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		
	}
	return (sxi32)(SyCharToLower(p[0]) - SyCharToLower(q[0]));
}